

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bean_ptr_impl.hpp
# Opt level: O2

void __thiscall hiberlite::real_bean<A>::save(real_bean<A> *this)

{
  bean_key bStack_28;
  
  if ((this->forgotten == false) && (this->obj != (A *)0x0)) {
    bean_key::bean_key(&bStack_28,&this->key);
    Database::dbUpdate<A>(&bStack_28,this->obj);
    shared_res<hiberlite::autoclosed_con>::~shared_res(&bStack_28.con);
  }
  return;
}

Assistant:

void real_bean<C>::save() {
	if(forgotten)
		return;
	if(!obj)
		return;
	Database::dbUpdate(key, *obj);
}